

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  bool *pbVar4;
  int iVar5;
  ImGuiContext *g;
  int iVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  ImRect unclipped_rect;
  ImRect local_48;
  float local_38;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar1 = GImGui->CurrentWindow;
    pbVar4 = &GImGui->CurrentTable->HostSkipItems;
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      pbVar4 = &pIVar1->SkipItems;
    }
    if (*pbVar4 == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    local_48.Min = (pIVar1->ClipRect).Min;
    local_48.Max = (pIVar1->ClipRect).Max;
    if (GImGui->NavMoveScoringItems == true) {
      local_38 = items_height;
      ImRect::Add(&local_48,&GImGui->NavScoringRect);
      items_height = local_38;
    }
    if ((pIVar2->NavJustMovedToId != 0) && (pIVar1->NavLastIds[0] == pIVar2->NavJustMovedToId)) {
      fVar11 = (pIVar1->Pos).y;
      fVar8 = pIVar1->NavRectRel[0].Min.y + fVar11;
      fVar11 = fVar11 + pIVar1->NavRectRel[0].Max.y;
      if (fVar8 < local_48.Min.y) {
        local_48.Min.y = fVar8;
      }
      if (local_48.Max.y < fVar11) {
        local_48.Max.y = fVar11;
      }
    }
    fVar11 = (pIVar1->DC).CursorPos.y;
    auVar9._0_4_ = local_48.Max.y - fVar11;
    auVar9._4_4_ = local_48.Min.y - fVar11;
    auVar9._8_4_ = local_48.Max.y - fVar11;
    auVar9._12_4_ = local_48.Max.y - fVar11;
    auVar10._4_4_ = items_height;
    auVar10._0_4_ = items_height;
    auVar10._8_4_ = items_height;
    auVar10._12_4_ = items_height;
    auVar10 = divps(auVar9,auVar10);
    iVar6 = (int)auVar10._0_4_;
    iVar7 = (int)auVar10._4_4_;
    if (pIVar2->NavMoveScoringItems == true) {
      iVar6 = iVar6 - ((int)-(uint)(pIVar2->NavMoveClipDir == 3) >> 0x1f);
      iVar7 = iVar7 - (uint)(pIVar2->NavMoveClipDir == 2);
    }
    iVar3 = items_count;
    if (iVar7 < items_count) {
      iVar3 = iVar7;
    }
    iVar5 = 0;
    if (-1 < iVar7) {
      iVar5 = iVar3;
    }
    iVar6 = iVar6 + 1;
    if (iVar6 < items_count) {
      items_count = iVar6;
    }
    if (iVar6 < iVar5) {
      items_count = iVar5;
    }
    *out_items_display_start = iVar5;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the scoring rect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveScoringItems)
        unclipped_rect.Add(g.NavScoringRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        unclipped_rect.Add(ImRect(window->Pos + window->NavRectRel[0].Min, window->Pos + window->NavRectRel[0].Max)); // Could store and use NavJustMovedToRectRel

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveScoringItems && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveScoringItems && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}